

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O0

void __thiscall ModuleTreeNode::~ModuleTreeNode(ModuleTreeNode *this)

{
  bool bVar1;
  ModuleTreeNode *this_00;
  iterator this_01;
  reference ppMVar2;
  string *in_RDI;
  ModuleTreeNode *m;
  iterator __end1;
  iterator __begin1;
  vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_> *__range1;
  ModuleTreeNode *in_stack_ffffffffffffffc8;
  __normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
  local_18;
  
  this_00 = (ModuleTreeNode *)(in_RDI + 0x50);
  local_18._M_current =
       (ModuleTreeNode **)
       std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>::begin
                 ((vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_> *)
                  in_stack_ffffffffffffffc8);
  this_01 = std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>::end
                      ((vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_> *)
                       in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffc8 = *ppMVar2;
    if (in_stack_ffffffffffffffc8 != (ModuleTreeNode *)0x0) {
      ~ModuleTreeNode(this_00);
      operator_delete(in_stack_ffffffffffffffc8);
    }
    __gnu_cxx::
    __normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>::~vector
            ((vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_> *)this_01._M_current);
  std::
  map<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::~map((map<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          *)0x1240fc);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

ModuleTreeNode::~ModuleTreeNode ()
{
  for (ModuleTreeNode* m : submodules) delete m;
}